

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall
helics::CommonCore::addDependency
          (CommonCore *this,LocalFederateId federateID,string_view federateName)

{
  string_view name;
  string_view message;
  char *__str;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  ActionMessage search;
  FederateState *fed;
  ActionMessage *in_stack_fffffffffffffeb8;
  BrokerBase *this_00;
  undefined4 in_stack_fffffffffffffed8;
  action_t in_stack_fffffffffffffedc;
  ActionMessage *in_stack_fffffffffffffee0;
  CommonCore *in_stack_fffffffffffffef8;
  LocalFederateId in_stack_ffffffffffffff04;
  undefined1 local_f8 [248];
  
  local_f8._208_8_ = getFederateAt(in_stack_fffffffffffffef8,in_stack_ffffffffffffff04);
  if ((FederateState *)local_f8._208_8_ == (FederateState *)0x0) {
    __str = (char *)__cxa_allocate_exception(0x28);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(in_RDI,__str);
    message._M_len._4_4_ = in_stack_fffffffffffffedc;
    message._M_len._0_4_ = in_stack_fffffffffffffed8;
    message._M_str = (char *)in_stack_fffffffffffffee0;
    InvalidIdentifier::InvalidIdentifier((InvalidIdentifier *)in_RDI,message);
    __cxa_throw(__str,&InvalidIdentifier::typeinfo,InvalidIdentifier::~InvalidIdentifier);
  }
  this_00 = (BrokerBase *)local_f8;
  ActionMessage::ActionMessage(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
  local_f8._8_4_ =
       std::atomic<helics::GlobalFederateId>::load
                 ((atomic<helics::GlobalFederateId> *)(local_f8._208_8_ + 0x2c),seq_cst);
  name._M_str = (char *)this_00;
  name._M_len = (size_t)in_stack_fffffffffffffeb8;
  ActionMessage::name((ActionMessage *)0x53cf5c,name);
  BrokerBase::addActionMessage(this_00,in_stack_fffffffffffffeb8);
  ActionMessage::~ActionMessage((ActionMessage *)this_00);
  return;
}

Assistant:

void CommonCore::addDependency(LocalFederateId federateID, std::string_view federateName)
{
    auto* fed = getFederateAt(federateID);
    if (fed == nullptr) {
        throw(InvalidIdentifier("federateID not valid (addDependency)"));
    }
    ActionMessage search(CMD_SEARCH_DEPENDENCY);
    search.source_id = fed->global_id.load();
    search.name(federateName);
    addActionMessage(std::move(search));
}